

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_rdlist.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte *pbVar1;
  int iVar2;
  char *pcVar3;
  byte *__ptr;
  FILE *pFVar4;
  size_t sVar5;
  ulong uVar6;
  char display_prompt_string2 [21];
  char display_prompt_string [21];
  char phone_number [17];
  
  if (argc < 2) {
    printf("Usage:\n\tmm_rdlist mm_table_%02x.bin [outputfile.bin]\n",0x37);
    return -1;
  }
  pcVar3 = table_to_string('7');
  printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n",pcVar3,0x37,0x37);
  __ptr = (byte *)calloc(1,0x23b);
  if (__ptr == (byte *)0x0) {
    printf("Failed to allocate %zu bytes.\n",0x23b);
    return -0xc;
  }
  pFVar4 = fopen(argv[1],"rb");
  if (pFVar4 == (FILE *)0x0) {
    printf("Error opening %s\n",argv[1]);
    free(__ptr);
LAB_001046bf:
    iVar2 = -2;
  }
  else {
    iVar2 = mm_validate_table_fsize('7',(FILE *)pFVar4,0x23a);
    if (iVar2 == 0) {
      sVar5 = fread(__ptr + 1,0x23a,1,pFVar4);
      if (sVar5 == 1) {
        fclose(pFVar4);
        printf(
              "+-----------------------------------------------------------------------------------------------+\n|  # | Pad            | Number           | Display Prompt       |  Pad2                         |\n+----+----------------+------------------+----------------------+-------------------------------+"
              );
        uVar6 = 0;
        pbVar1 = __ptr;
        do {
          callscrn_num_to_string(phone_number,0x11,pbVar1 + 4,8);
          if ((char)pbVar1[0xc] < ' ') {
            builtin_strncpy(display_prompt_string,"                    ",0x14);
          }
          else {
            display_prompt_string._16_4_ = *(undefined4 *)(pbVar1 + 0x1c);
            display_prompt_string._0_8_ = *(undefined8 *)(pbVar1 + 0xc);
            display_prompt_string._8_5_ = (undefined5)*(undefined8 *)(pbVar1 + 0x14);
            display_prompt_string._13_3_ =
                 (undefined3)((ulong)*(undefined8 *)(pbVar1 + 0x14) >> 0x28);
          }
          display_prompt_string[0x14] = '\0';
          if ((char)pbVar1[0x20] < ' ') {
            builtin_strncpy(display_prompt_string2,"                    ",0x14);
          }
          else {
            display_prompt_string2._16_4_ = *(undefined4 *)(pbVar1 + 0x30);
            display_prompt_string2._0_4_ = *(undefined4 *)(pbVar1 + 0x20);
            display_prompt_string2._4_4_ = *(undefined4 *)(pbVar1 + 0x24);
            display_prompt_string2._8_4_ = *(undefined4 *)(pbVar1 + 0x28);
            display_prompt_string2._12_4_ = *(undefined4 *)(pbVar1 + 0x2c);
          }
          display_prompt_string2[0x14] = '\0';
          printf("\n| %2d | 0x%02x,0x%02x,0x%02x | %16s | %s | 0x%02x,0x%02x,0x%02x,0x%02x,0x%02x,0x%02x |"
                 ,uVar6 & 0xffffffff,(ulong)pbVar1[1],(ulong)pbVar1[2],(ulong)pbVar1[3],phone_number
                 ,display_prompt_string,(ulong)pbVar1[0x34],(ulong)pbVar1[0x35],(ulong)pbVar1[0x36],
                 (ulong)pbVar1[0x37],(ulong)pbVar1[0x38],(ulong)pbVar1[0x39]);
          printf("\n|    |                |                  | %s |                               |"
                 ,display_prompt_string2);
          uVar6 = uVar6 + 1;
          pbVar1 = pbVar1 + 0x39;
        } while (uVar6 != 10);
        puts(
            "\n+-----------------------------------------------------------------------------------------------+"
            );
        __ptr[4] = 0;
        __ptr[5] = 0;
        __ptr[6] = 0;
        __ptr[7] = 0;
        __ptr[8] = 0;
        __ptr[9] = 0;
        __ptr[10] = 0;
        __ptr[0xb] = 0;
        __ptr[0x2c] = 0x20;
        __ptr[0x2d] = 0x20;
        __ptr[0x2e] = 0x20;
        __ptr[0x2f] = 0x20;
        __ptr[0x30] = 0x20;
        __ptr[0x31] = 0x20;
        __ptr[0x32] = 0x20;
        __ptr[0x33] = 0x20;
        __ptr[0xc] = '*';
        __ptr[0xd] = '*';
        __ptr[0xe] = '*';
        __ptr[0xf] = ' ';
        __ptr[0x10] = ' ';
        __ptr[0x11] = ' ';
        __ptr[0x12] = ' ';
        __ptr[0x13] = ' ';
        __ptr[0x14] = ' ';
        __ptr[0x15] = ' ';
        __ptr[0x16] = ' ';
        __ptr[0x17] = ' ';
        __ptr[0x18] = ' ';
        __ptr[0x19] = ' ';
        __ptr[0x1a] = ' ';
        __ptr[0x1b] = ' ';
        __ptr[0x1c] = ' ';
        __ptr[0x1d] = ' ';
        __ptr[0x1e] = ' ';
        __ptr[0x1f] = ' ';
        __ptr[0x20] = ' ';
        __ptr[0x21] = ' ';
        __ptr[0x22] = ' ';
        __ptr[0x23] = ' ';
        __ptr[0x24] = ' ';
        __ptr[0x25] = ' ';
        __ptr[0x26] = ' ';
        __ptr[0x27] = ' ';
        __ptr[0x28] = ' ';
        __ptr[0x29] = ' ';
        __ptr[0x2a] = ' ';
        __ptr[0x2b] = ' ';
        string_to_bcd_a("18004880097",__ptr + 0x121,'\b');
        __ptr[0x149] = 0x53;
        __ptr[0x14a] = 0x54;
        __ptr[0x14b] = 0x20;
        __ptr[0x14c] = 0x20;
        __ptr[0x14d] = 0x20;
        __ptr[0x14e] = 0x20;
        __ptr[0x14f] = 0x20;
        __ptr[0x150] = 0x20;
        __ptr[0x129] = ' ';
        __ptr[0x12a] = ' ';
        __ptr[299] = ' ';
        __ptr[300] = ' ';
        __ptr[0x12d] = ' ';
        __ptr[0x12e] = ' ';
        __ptr[0x12f] = ' ';
        __ptr[0x130] = ' ';
        __ptr[0x131] = 'M';
        __ptr[0x132] = 'C';
        __ptr[0x133] = 'I';
        __ptr[0x134] = ' ';
        __ptr[0x135] = ' ';
        __ptr[0x136] = ' ';
        __ptr[0x137] = ' ';
        __ptr[0x138] = ' ';
        __ptr[0x139] = ' ';
        __ptr[0x13a] = ' ';
        __ptr[0x13b] = ' ';
        __ptr[0x13c] = ' ';
        __ptr[0x13d] = ' ';
        __ptr[0x13e] = ' ';
        __ptr[0x13f] = ' ';
        __ptr[0x140] = ' ';
        __ptr[0x141] = ' ';
        __ptr[0x142] = '0';
        __ptr[0x143] = '2';
        __ptr[0x144] = '2';
        __ptr[0x145] = '2';
        __ptr[0x146] = ' ';
        __ptr[0x147] = 'T';
        __ptr[0x148] = 'E';
        string_to_bcd_a("18002882060",__ptr + 0x15a,'\b');
        __ptr[0x182] = 0x53;
        __ptr[0x183] = 0x54;
        __ptr[0x184] = 0x20;
        __ptr[0x185] = 0x20;
        __ptr[0x186] = 0x20;
        __ptr[0x187] = 0x20;
        __ptr[0x188] = 0x20;
        __ptr[0x189] = 0x20;
        __ptr[0x162] = ' ';
        __ptr[0x163] = ' ';
        __ptr[0x164] = ' ';
        __ptr[0x165] = ' ';
        __ptr[0x166] = ' ';
        __ptr[0x167] = ' ';
        __ptr[0x168] = ' ';
        __ptr[0x169] = ' ';
        __ptr[0x16a] = 'A';
        __ptr[0x16b] = 'T';
        __ptr[0x16c] = '&';
        __ptr[0x16d] = 'T';
        __ptr[0x16e] = ' ';
        __ptr[0x16f] = ' ';
        __ptr[0x170] = ' ';
        __ptr[0x171] = ' ';
        __ptr[0x172] = ' ';
        __ptr[0x173] = ' ';
        __ptr[0x174] = ' ';
        __ptr[0x175] = ' ';
        __ptr[0x176] = ' ';
        __ptr[0x177] = ' ';
        __ptr[0x178] = ' ';
        __ptr[0x179] = ' ';
        __ptr[0x17a] = ' ';
        __ptr[0x17b] = '0';
        __ptr[0x17c] = '2';
        __ptr[0x17d] = '8';
        __ptr[0x17e] = '8';
        __ptr[0x17f] = ' ';
        __ptr[0x180] = 'T';
        __ptr[0x181] = 'E';
        string_to_bcd_a("18002255288",__ptr + 0x193,'\b');
        __ptr[0x1bb] = 0x53;
        __ptr[0x1bc] = 0x54;
        __ptr[0x1bd] = 0x20;
        __ptr[0x1be] = 0x20;
        __ptr[0x1bf] = 0x20;
        __ptr[0x1c0] = 0x20;
        __ptr[0x1c1] = 0x20;
        __ptr[0x1c2] = 0x20;
        __ptr[0x19b] = ' ';
        __ptr[0x19c] = ' ';
        __ptr[0x19d] = ' ';
        __ptr[0x19e] = ' ';
        __ptr[0x19f] = ' ';
        __ptr[0x1a0] = ' ';
        __ptr[0x1a1] = ' ';
        __ptr[0x1a2] = ' ';
        __ptr[0x1a3] = 'M';
        __ptr[0x1a4] = 'C';
        __ptr[0x1a5] = 'I';
        __ptr[0x1a6] = ' ';
        __ptr[0x1a7] = ' ';
        __ptr[0x1a8] = ' ';
        __ptr[0x1a9] = ' ';
        __ptr[0x1aa] = ' ';
        __ptr[0x1ab] = ' ';
        __ptr[0x1ac] = ' ';
        __ptr[0x1ad] = ' ';
        __ptr[0x1ae] = ' ';
        __ptr[0x1af] = ' ';
        __ptr[0x1b0] = ' ';
        __ptr[0x1b1] = ' ';
        __ptr[0x1b2] = ' ';
        __ptr[0x1b3] = ' ';
        __ptr[0x1b4] = '0';
        __ptr[0x1b5] = '5';
        __ptr[0x1b6] = '5';
        __ptr[0x1b7] = '5';
        __ptr[0x1b8] = ' ';
        __ptr[0x1b9] = 'T';
        __ptr[0x1ba] = 'E';
        string_to_bcd_a("18006261044",__ptr + 0x1cc,'\b');
        __ptr[500] = 0x57;
        __ptr[0x1f5] = 0x41;
        __ptr[0x1f6] = 0x54;
        __ptr[0x1f7] = 0x54;
        __ptr[0x1f8] = 0x20;
        __ptr[0x1f9] = 0x20;
        __ptr[0x1fa] = 0x20;
        __ptr[0x1fb] = 0x20;
        __ptr[0x1d4] = ' ';
        __ptr[0x1d5] = ' ';
        __ptr[0x1d6] = ' ';
        __ptr[0x1d7] = ' ';
        __ptr[0x1d8] = ' ';
        __ptr[0x1d9] = '0';
        __ptr[0x1da] = '3';
        __ptr[0x1db] = '3';
        __ptr[0x1dc] = '3';
        __ptr[0x1dd] = ' ';
        __ptr[0x1de] = 'T';
        __ptr[0x1df] = 'E';
        __ptr[0x1e0] = 'S';
        __ptr[0x1e1] = 'T';
        __ptr[0x1e2] = ' ';
        __ptr[0x1e3] = ' ';
        __ptr[0x1e4] = ' ';
        __ptr[0x1e5] = ' ';
        __ptr[0x1e6] = ' ';
        __ptr[0x1e7] = ' ';
        __ptr[0x1e8] = ' ';
        __ptr[0x1e9] = ' ';
        __ptr[0x1ea] = ' ';
        __ptr[0x1eb] = 'L';
        __ptr[0x1ec] = 'W';
        __ptr[0x1ed] = 'M';
        __ptr[0x1ee] = ' ';
        __ptr[0x1ef] = 'M';
        __ptr[0x1f0] = 'I';
        __ptr[0x1f1] = 'L';
        __ptr[0x1f2] = 'L';
        __ptr[499] = 'I';
        string_to_bcd_a("12027621401",__ptr + 0x205,'\b');
        __ptr[0x22d] = 0x55;
        __ptr[0x22e] = 0x52;
        __ptr[0x22f] = 0x45;
        __ptr[0x230] = 0x20;
        __ptr[0x231] = 0x20;
        __ptr[0x232] = 0x20;
        __ptr[0x233] = 0x20;
        __ptr[0x234] = 0x20;
        __ptr[0x20d] = ' ';
        __ptr[0x20e] = ' ';
        __ptr[0x20f] = ' ';
        __ptr[0x210] = ' ';
        __ptr[0x211] = 'T';
        __ptr[0x212] = 'I';
        __ptr[0x213] = 'M';
        __ptr[0x214] = 'E';
        __ptr[0x215] = ' ';
        __ptr[0x216] = 'A';
        __ptr[0x217] = 'N';
        __ptr[0x218] = 'D';
        __ptr[0x219] = ' ';
        __ptr[0x21a] = ' ';
        __ptr[0x21b] = ' ';
        __ptr[0x21c] = ' ';
        __ptr[0x21d] = ' ';
        __ptr[0x21e] = ' ';
        __ptr[0x21f] = ' ';
        __ptr[0x220] = ' ';
        __ptr[0x221] = ' ';
        __ptr[0x222] = ' ';
        __ptr[0x223] = ' ';
        __ptr[0x224] = ' ';
        __ptr[0x225] = 'T';
        __ptr[0x226] = 'E';
        __ptr[0x227] = 'M';
        __ptr[0x228] = 'P';
        __ptr[0x229] = 'E';
        __ptr[0x22a] = 'R';
        __ptr[0x22b] = 'A';
        __ptr[0x22c] = 'T';
        iVar2 = 0;
        if (argc == 2) {
LAB_00104680:
          free(__ptr);
          return iVar2;
        }
        pFVar4 = fopen(argv[2],"wb");
        if (pFVar4 != (FILE *)0x0) {
          iVar2 = 0;
          printf("\nWriting new table to %s\n",argv[2]);
          sVar5 = fwrite(__ptr + 1,0x23a,1,pFVar4);
          if (sVar5 != 1) {
            printf("Error writing output file %s\n",argv[2]);
            iVar2 = -5;
          }
          fclose(pFVar4);
          goto LAB_00104680;
        }
        printf("Error opening output file %s for write.\n",argv[2]);
        goto LAB_001046bf;
      }
      pcVar3 = table_to_string('7');
      printf("Error reading %s table.\n",pcVar3);
    }
    free(__ptr);
    fclose(pFVar4);
    iVar2 = -5;
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE *instream;
    FILE *ostream = NULL;
    int   rdlist_index;
    char  phone_number[17];
    char  display_prompt_string[21];
    char  display_prompt_string2[21];
    int   ret = 0;

    dlog_mt_rdlist_table_t *ptable;
    uint8_t* load_buffer;

    if (argc <= 1) {
        printf("Usage:\n" \
               "\tmm_rdlist mm_table_%02x.bin [outputfile.bin]\n", TABLE_ID);
        return -1;
    }

    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n", table_to_string(TABLE_ID), TABLE_ID, TABLE_ID);

    ptable = (dlog_mt_rdlist_table_t *)calloc(1, sizeof(dlog_mt_rdlist_table_t));

    if (ptable == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_rdlist_table_t));
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(ptable);
        return -ENOENT;
    }

    if (mm_validate_table_fsize(TABLE_ID, instream, sizeof(dlog_mt_rdlist_table_t) - 1) != 0) {
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    load_buffer = ((uint8_t*)ptable) + 1;
    if (fread(load_buffer, sizeof(dlog_mt_rdlist_table_t) - 1, 1, instream) != 1) {
        printf("Error reading %s table.\n", table_to_string(TABLE_ID));
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    fclose(instream);

    printf("+-----------------------------------------------------------------------------------------------+\n" \
           "|  # | Pad            | Number           | Display Prompt       |  Pad2                         |\n" \
           "+----+----------------+------------------+----------------------+-------------------------------+");

    for (rdlist_index = 0; rdlist_index < RDLIST_MAX; rdlist_index++) {
        callscrn_num_to_string(phone_number, sizeof(phone_number), ptable->rd[rdlist_index].phone_number, 8);

        if (ptable->rd[rdlist_index].display_prompt[0] >= 0x20) {
            memcpy(display_prompt_string, ptable->rd[rdlist_index].display_prompt, 20);
            display_prompt_string[20] = '\0';
        } else {
            snprintf(display_prompt_string, sizeof(display_prompt_string), "%s", "                    ");
        }

        if (ptable->rd[rdlist_index].display_prompt[20] >= 0x20) {
            memcpy(display_prompt_string2, &(ptable->rd[rdlist_index].display_prompt[20]), 20);
            display_prompt_string2[20] = '\0';
        } else {
            snprintf(display_prompt_string2, sizeof(display_prompt_string2), "%s", "                    ");
        }

        printf("\n| %2d | 0x%02x,0x%02x,0x%02x | %16s | %s | 0x%02x,0x%02x,0x%02x,0x%02x,0x%02x,0x%02x |",
               rdlist_index,
               ptable->rd[rdlist_index].pad[0],
               ptable->rd[rdlist_index].pad[1],
               ptable->rd[rdlist_index].pad[2],
               phone_number,
               display_prompt_string,
               ptable->rd[rdlist_index].pad2[0],
               ptable->rd[rdlist_index].pad2[1],
               ptable->rd[rdlist_index].pad2[2],
               ptable->rd[rdlist_index].pad2[3],
               ptable->rd[rdlist_index].pad2[4],
               ptable->rd[rdlist_index].pad2[5]);

        printf("\n|    |                |                  | %s |                               |",
               display_prompt_string2);
    }

    printf("\n+-----------------------------------------------------------------------------------------------+\n");

    /* Modify RDLIST table */

    /* Entries 0-4 are the upper five buttons, only accessible on terminals with 10-button Repertory Dialer
     * For five button sets, entry 0 has *** as the display prompt with a zeroed out phone_number.
     */

    /* Button 1 */
    memset(ptable->rd[0].phone_number, 0, sizeof(ptable->rd[0].phone_number));
    memcpy(ptable->rd[0].display_prompt, "***                                     ", sizeof(ptable->rd[0].display_prompt));

    /* These are the lower (or only) five buttons. */
    /* Button 6 */
    /*   Number to dial, upto 16 digits */
    string_to_bcd_a("18004880097", ptable->rd[5].phone_number, sizeof(ptable->rd[0].phone_number));
    /*                                   "LINE ONE OF DISPLAY LINE TWO OF DISPLAY " */
    memcpy(ptable->rd[5].display_prompt, "        MCI              0222 TEST      ", sizeof(ptable->rd[0].display_prompt));

    /* Button 7 */
    string_to_bcd_a("18002882060", ptable->rd[6].phone_number, sizeof(ptable->rd[0].phone_number));
    memcpy(ptable->rd[6].display_prompt, "        AT&T             0288 TEST      ", sizeof(ptable->rd[0].display_prompt));

    /* Button 8 */
    string_to_bcd_a("18002255288", ptable->rd[7].phone_number, sizeof(ptable->rd[0].phone_number));
    memcpy(ptable->rd[7].display_prompt, "        MCI              0555 TEST      ", sizeof(ptable->rd[0].display_prompt));

    /* Button 9 */
    string_to_bcd_a("18006261044", ptable->rd[8].phone_number, sizeof(ptable->rd[0].phone_number));
    memcpy(ptable->rd[8].display_prompt, "     0333 TEST         LWM MILLIWATT    ", sizeof(ptable->rd[0].display_prompt));

    /* Button 10 */
    string_to_bcd_a("12027621401", ptable->rd[9].phone_number, sizeof(ptable->rd[0].phone_number));
    memcpy(ptable->rd[9].display_prompt, "    TIME AND            TEMPERATURE     ", sizeof(ptable->rd[0].display_prompt));

    if (argc > 2) {
        if ((ostream = fopen(argv[2], "wb")) == NULL) {
            printf("Error opening output file %s for write.\n", argv[2]);
            return -ENOENT;
        }
    }

    /* If output file was specified, write it. */
    if (ostream != NULL) {
        printf("\nWriting new table to %s\n", argv[2]);

        if (fwrite(load_buffer, sizeof(dlog_mt_rdlist_table_t) - 1, 1, ostream) != 1) {
            printf("Error writing output file %s\n", argv[2]);
            ret = -EIO;
        }
        fclose(ostream);
    }

    if (ptable != NULL) {
        free(ptable);
    }

    return ret;
}